

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_compResetPolicy_e crp,ZSTD_indexResetPolicy_e forceResetIndex,
                 ZSTD_resetTarget_e forWho)

{
  uint uVar1;
  ZSTD_cwksp_alloc_phase_e ZVar2;
  U32 *pUVar3;
  uint *puVar4;
  ZSTD_match_t *pZVar5;
  ZSTD_optimal_t *pZVar6;
  ZSTD_strategy ZVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  U32 UVar12;
  void *pvVar13;
  void *pvVar14;
  size_t sVar15;
  void *alloc;
  U32 *pUVar16;
  uint uVar17;
  void *pvVar18;
  ZSTD_optimal_t *pZVar19;
  void *alloc_1;
  long lVar20;
  U32 *pUVar21;
  uint *puVar22;
  ZSTD_match_t *pZVar23;
  
  if (cParams->strategy == ZSTD_fast) {
    lVar20 = 0;
  }
  else {
    lVar20 = 4L << ((byte)cParams->chainLog & 0x3f);
  }
  uVar17 = 0;
  if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->minMatch == 3)) {
    uVar17 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar17 = cParams->windowLog;
    }
  }
  uVar1 = cParams->hashLog;
  if (forceResetIndex == ZSTDirp_reset) {
    (ms->window).nextSrc = (BYTE *)0x0;
    (ms->window).base = (BYTE *)0x0;
    (ms->window).dictBase = (BYTE *)0x0;
    (ms->window).dictLimit = 0;
    (ms->window).lowLimit = 0;
    (ms->window).base = "";
    (ms->window).dictBase = "";
    (ms->window).dictLimit = 1;
    (ms->window).lowLimit = 1;
    (ms->window).nextSrc = (BYTE *)"num chunks = %li (bit plane) and %li (exponent) \n";
    if (ws->tableValidEnd < ws->objectEnd) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1d55,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    if (ws->allocStart < ws->tableValidEnd) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1d56,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    ws->tableValidEnd = ws->objectEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
  }
  ms->hashLog3 = uVar17;
  UVar12 = *(int *)&(ms->window).nextSrc - *(int *)&(ms->window).base;
  (ms->window).lowLimit = UVar12;
  (ms->window).dictLimit = UVar12;
  ms->nextToUpdate = UVar12;
  ms->loadedDictEnd = 0;
  (ms->opt).litLengthSum = 0;
  ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  if (ws->allocFailed != 0) {
    __assert_fail("!ZSTD_cwksp_reserve_failed(ws)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2f8b,
                  "size_t ZSTD_reset_matchState(ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_compressionParameters *, const ZSTD_compResetPolicy_e, const ZSTD_indexResetPolicy_e, const ZSTD_resetTarget_e)"
                 );
  }
  ws->tableEnd = ws->objectEnd;
  ZSTD_cwksp_assert_internal_consistency(ws);
  ZVar2 = ws->phase;
  if ((int)ZVar2 < 3) {
    pUVar3 = (U32 *)ws->tableEnd;
    pUVar21 = (U32 *)ws->allocStart;
    pUVar16 = (U32 *)((4L << ((byte)uVar1 & 0x3f)) + (long)pUVar3);
    if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
      if ((int)ZVar2 < 1) {
        ws->tableValidEnd = ws->objectEnd;
      }
      pvVar13 = (void *)((ulong)pUVar21 & 0xfffffffffffffffc);
      ws->allocStart = pvVar13;
      if (pvVar13 < ws->tableValidEnd) {
        ws->tableValidEnd = pvVar13;
      }
      ws->phase = ZSTD_cwksp_alloc_aligned;
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pUVar16 <= pUVar21) {
      ws->tableEnd = pUVar16;
      ms->hashTable = pUVar3;
      ZVar2 = ws->phase;
      if (2 < (int)ZVar2) goto LAB_00170a50;
      pUVar21 = (U32 *)(lVar20 + (long)pUVar16);
      pUVar3 = (U32 *)ws->allocStart;
      if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
        if ((int)ZVar2 < 1) {
          ws->tableValidEnd = ws->objectEnd;
        }
        pvVar13 = (void *)((ulong)pUVar3 & 0xfffffffffffffffc);
        ws->allocStart = pvVar13;
        if (pvVar13 < ws->tableValidEnd) {
          ws->tableValidEnd = pvVar13;
        }
        ws->phase = ZSTD_cwksp_alloc_aligned;
      }
      ZSTD_cwksp_assert_internal_consistency(ws);
      if (pUVar21 <= pUVar3) {
        ws->tableEnd = pUVar21;
        ms->chainTable = pUVar16;
        lVar20 = 4L << ((byte)uVar17 & 0x3f);
        if (uVar17 == 0) {
          lVar20 = 0;
        }
        ZVar2 = ws->phase;
        if (2 < (int)ZVar2) goto LAB_00170a50;
        pvVar18 = (void *)(lVar20 + (long)pUVar21);
        pvVar13 = ws->allocStart;
        if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
          if ((int)ZVar2 < 1) {
            ws->tableValidEnd = ws->objectEnd;
          }
          pvVar14 = (void *)((ulong)pvVar13 & 0xfffffffffffffffc);
          ws->allocStart = pvVar14;
          if (pvVar14 < ws->tableValidEnd) {
            ws->tableValidEnd = pvVar14;
          }
          ws->phase = ZSTD_cwksp_alloc_aligned;
        }
        ZSTD_cwksp_assert_internal_consistency(ws);
        if (pvVar18 <= pvVar13) {
          ws->tableEnd = pvVar18;
          ms->hashTable3 = pUVar21;
          sVar15 = 0xffffffffffffffc0;
          if (ws->allocFailed == 0) {
            if (crp != ZSTDcrp_leaveDirty) {
              pvVar13 = ws->tableValidEnd;
              if (pvVar13 < ws->objectEnd) {
                __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1d6a,"void ZSTD_cwksp_clean_tables(ZSTD_cwksp *)");
              }
              if (ws->allocStart < pvVar13) {
                __assert_fail("ws->tableValidEnd <= ws->allocStart",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1d6b,"void ZSTD_cwksp_clean_tables(ZSTD_cwksp *)");
              }
              if (pvVar13 < pvVar18) {
                memset(pvVar13,0,(long)pvVar18 - (long)pvVar13);
              }
              pvVar13 = ws->tableValidEnd;
              if (pvVar13 < ws->objectEnd) {
                __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1d5d,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
              }
              if (ws->allocStart < pvVar13) {
                __assert_fail("ws->tableValidEnd <= ws->allocStart",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1d5e,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
              }
              if (pvVar13 < ws->tableEnd) {
                ws->tableValidEnd = ws->tableEnd;
              }
              ZSTD_cwksp_assert_internal_consistency(ws);
            }
            if ((forWho == ZSTD_resetTarget_CCtx) && (6 < (int)cParams->strategy)) {
              ZVar2 = ws->phase;
              if (2 < (int)ZVar2) goto LAB_00170a50;
              puVar4 = (uint *)ws->tableEnd;
              if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
                if ((int)ZVar2 < 1) {
                  ws->tableValidEnd = ws->objectEnd;
                }
                pvVar13 = (void *)((ulong)ws->allocStart & 0xfffffffffffffffc);
                ws->allocStart = pvVar13;
                if (pvVar13 < ws->tableValidEnd) {
                  ws->tableValidEnd = pvVar13;
                }
                ws->phase = ZSTD_cwksp_alloc_aligned;
              }
              puVar22 = (uint *)((long)ws->allocStart + -0x400);
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (puVar22 < puVar4) {
LAB_00170aad:
                __assert_fail("alloc >= bottom",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1cdd,
                              "void *ZSTD_cwksp_reserve_internal(ZSTD_cwksp *, size_t, ZSTD_cwksp_alloc_phase_e)"
                             );
              }
              if (puVar22 < ws->tableValidEnd) {
                ws->tableValidEnd = puVar22;
              }
              ws->allocStart = puVar22;
              (ms->opt).litFreq = puVar22;
              ZVar2 = ws->phase;
              if (2 < (int)ZVar2) goto LAB_00170a50;
              puVar4 = (uint *)ws->tableEnd;
              if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
                if ((int)ZVar2 < 1) {
                  ws->tableValidEnd = ws->objectEnd;
                }
                pvVar13 = (void *)((ulong)puVar22 & 0xfffffffffffffffc);
                ws->allocStart = pvVar13;
                if (pvVar13 < ws->tableValidEnd) {
                  ws->tableValidEnd = pvVar13;
                }
                ws->phase = ZSTD_cwksp_alloc_aligned;
              }
              puVar22 = (uint *)((long)ws->allocStart + -0x90);
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (puVar22 < puVar4) goto LAB_00170aad;
              if (puVar22 < ws->tableValidEnd) {
                ws->tableValidEnd = puVar22;
              }
              ws->allocStart = puVar22;
              (ms->opt).litLengthFreq = puVar22;
              ZVar2 = ws->phase;
              if (2 < (int)ZVar2) goto LAB_00170a50;
              puVar4 = (uint *)ws->tableEnd;
              if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
                if ((int)ZVar2 < 1) {
                  ws->tableValidEnd = ws->objectEnd;
                }
                pvVar13 = (void *)((ulong)puVar22 & 0xfffffffffffffffc);
                ws->allocStart = pvVar13;
                if (pvVar13 < ws->tableValidEnd) {
                  ws->tableValidEnd = pvVar13;
                }
                ws->phase = ZSTD_cwksp_alloc_aligned;
              }
              puVar22 = (uint *)((long)ws->allocStart + -0xd4);
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (puVar22 < puVar4) goto LAB_00170aad;
              if (puVar22 < ws->tableValidEnd) {
                ws->tableValidEnd = puVar22;
              }
              ws->allocStart = puVar22;
              (ms->opt).matchLengthFreq = puVar22;
              ZVar2 = ws->phase;
              if (2 < (int)ZVar2) goto LAB_00170a50;
              puVar4 = (uint *)ws->tableEnd;
              if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
                if ((int)ZVar2 < 1) {
                  ws->tableValidEnd = ws->objectEnd;
                }
                pvVar13 = (void *)((ulong)puVar22 & 0xfffffffffffffffc);
                ws->allocStart = pvVar13;
                if (pvVar13 < ws->tableValidEnd) {
                  ws->tableValidEnd = pvVar13;
                }
                ws->phase = ZSTD_cwksp_alloc_aligned;
              }
              puVar22 = (uint *)((long)ws->allocStart + -0x80);
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (puVar22 < puVar4) goto LAB_00170aad;
              if (puVar22 < ws->tableValidEnd) {
                ws->tableValidEnd = puVar22;
              }
              ws->allocStart = puVar22;
              (ms->opt).offCodeFreq = puVar22;
              ZVar2 = ws->phase;
              if (2 < (int)ZVar2) goto LAB_00170a50;
              pZVar5 = (ZSTD_match_t *)ws->tableEnd;
              if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
                if ((int)ZVar2 < 1) {
                  ws->tableValidEnd = ws->objectEnd;
                }
                pvVar13 = (void *)((ulong)puVar22 & 0xfffffffffffffffc);
                ws->allocStart = pvVar13;
                if (pvVar13 < ws->tableValidEnd) {
                  ws->tableValidEnd = pvVar13;
                }
                ws->phase = ZSTD_cwksp_alloc_aligned;
              }
              pZVar23 = (ZSTD_match_t *)((long)ws->allocStart + -0x8008);
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (pZVar23 < pZVar5) goto LAB_00170aad;
              if (pZVar23 < (ZSTD_match_t *)ws->tableValidEnd) {
                ws->tableValidEnd = pZVar23;
              }
              ws->allocStart = pZVar23;
              (ms->opt).matchTable = pZVar23;
              ZVar2 = ws->phase;
              if (2 < (int)ZVar2) goto LAB_00170a50;
              pZVar6 = (ZSTD_optimal_t *)ws->tableEnd;
              if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
                if ((int)ZVar2 < 1) {
                  ws->tableValidEnd = ws->objectEnd;
                }
                pvVar13 = (void *)((ulong)pZVar23 & 0xfffffffffffffffc);
                ws->allocStart = pvVar13;
                if (pvVar13 < ws->tableValidEnd) {
                  ws->tableValidEnd = pvVar13;
                }
                ws->phase = ZSTD_cwksp_alloc_aligned;
              }
              pZVar19 = (ZSTD_optimal_t *)((long)ws->allocStart + -0x1c01c);
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (pZVar19 < pZVar6) goto LAB_00170aad;
              if (pZVar19 < (ZSTD_optimal_t *)ws->tableValidEnd) {
                ws->tableValidEnd = pZVar19;
              }
              ws->allocStart = pZVar19;
              (ms->opt).priceTable = pZVar19;
            }
            uVar8 = cParams->windowLog;
            uVar9 = cParams->chainLog;
            uVar10 = cParams->hashLog;
            uVar11 = cParams->searchLog;
            uVar17 = cParams->minMatch;
            uVar1 = cParams->targetLength;
            ZVar7 = cParams->strategy;
            (ms->cParams).searchLog = cParams->searchLog;
            (ms->cParams).minMatch = uVar17;
            (ms->cParams).targetLength = uVar1;
            (ms->cParams).strategy = ZVar7;
            (ms->cParams).windowLog = uVar8;
            (ms->cParams).chainLog = uVar9;
            (ms->cParams).hashLog = uVar10;
            (ms->cParams).searchLog = uVar11;
            sVar15 = (ulong)(ws->allocFailed == 0) * 0x40 - 0x40;
          }
          return sVar15;
        }
      }
    }
    __assert_fail("end <= top",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x1d11,"void *ZSTD_cwksp_reserve_table(ZSTD_cwksp *, size_t)");
  }
LAB_00170a50:
  __assert_fail("phase >= ws->phase",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x1cac,
                "void ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *, ZSTD_cwksp_alloc_phase_e)");
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    size_t const chainSize = (cParams->strategy == ZSTD_fast) ? 0 : ((size_t)1 << cParams->chainLog);
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    return 0;
}